

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void write_N(ofstream *fout_N)

{
  ostream *poVar1;
  double N_ph;
  double N_p;
  double N_e;
  
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xb0,&N_e,1,
             &ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xb8,&N_p,1,
             &ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xc0,&N_ph,1,
             &ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  if (mpi_rank == 0) {
    poVar1 = std::ostream::_M_insert<double>(N_e);
    std::operator<<(poVar1,'\t');
    poVar1 = std::ostream::_M_insert<double>(N_p);
    std::operator<<(poVar1,'\t');
    poVar1 = std::ostream::_M_insert<double>(N_ph);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void write_N(ofstream& fout_N)
{
    double N_e,N_p,N_ph;
    MPI_Reduce(&(psr->N_e), &N_e, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->N_p), &N_p, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->N_ph), &N_ph, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    if (mpi_rank == 0) {
        fout_N<<N_e<<'\t'<<N_p<<'\t'<<N_ph<<endl;
    }
}